

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionParser::ParseContent
          (cmGeneratorExpressionParser *this,
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          *result)

{
  uint uVar1;
  char *start;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pcVar5;
  reference ppcVar6;
  TextContent *pTVar7;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_88;
  cmGeneratorExpressionToken *local_80;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_78;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_70 [3];
  TextContent *local_58;
  cmGeneratorExpressionEvaluator *n;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_48;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_40;
  TextContent *local_38;
  TextContent *textContent;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_28;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_20;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_18;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *result_local;
  cmGeneratorExpressionParser *this_local;
  
  local_18 = result;
  result_local = (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *)this;
  local_20._M_current =
       (cmGeneratorExpressionToken *)
       std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                 (&this->Tokens);
  bVar2 = __gnu_cxx::operator!=(&this->it,&local_20);
  if (!bVar2) {
    __assert_fail("this->it != this->Tokens.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionParser.cxx"
                  ,0xd3,
                  "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                 );
  }
  pcVar5 = __gnu_cxx::
           __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
           ::operator->(&this->it);
  uVar1 = pcVar5->TokenType;
  if (uVar1 == 0) {
    if (this->NestingLevel == 0) {
      bVar3 = std::
              vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ::empty(local_18);
      bVar2 = false;
      if (!bVar3) {
        textContent = (TextContent *)
                      std::
                      vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                      ::end(local_18);
        local_28 = __gnu_cxx::
                   __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                   ::operator-((__normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                                *)&textContent,1);
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                  ::operator*(&local_28);
        iVar4 = (*(*ppcVar6)->_vptr_cmGeneratorExpressionEvaluator[2])();
        bVar2 = iVar4 == 0;
      }
      if (bVar2) {
        local_48._M_current =
             (cmGeneratorExpressionEvaluator **)
             std::
             vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             ::end(local_18);
        local_40 = __gnu_cxx::
                   __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                   ::operator-(&local_48,1);
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                  ::operator*(&local_40);
        pTVar7 = (TextContent *)*ppcVar6;
        local_38 = pTVar7;
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                 ::operator->(&this->it);
        TextContent::Extend(pTVar7,pcVar5->Length);
        n = (cmGeneratorExpressionEvaluator *)
            std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
            end(&this->Tokens);
        bVar2 = __gnu_cxx::operator!=
                          (&this->it,
                           (__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                            *)&n);
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
          ::operator++(&this->it);
          return;
        }
        __assert_fail("this->it != this->Tokens.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionParser.cxx"
                      ,0xe0,
                      "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                     );
      }
    }
    pTVar7 = (TextContent *)operator_new(0x18);
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    start = pcVar5->Content;
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    TextContent::TextContent(pTVar7,start,pcVar5->Length);
    local_58 = pTVar7;
    std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
    ::push_back(local_18,(value_type *)&local_58);
    local_70[0]._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar2 = __gnu_cxx::operator!=(&this->it,local_70);
    if (!bVar2) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xe8,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator++(&this->it);
  }
  else if (uVar1 == 1) {
    local_78._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar2 = __gnu_cxx::operator!=(&this->it,&local_78);
    if (!bVar2) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xed,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator++(&this->it);
    ParseGeneratorExpression(this,local_18);
  }
  else {
    if (2 < uVar1 - 2) {
      __assert_fail("false && \"Unhandled token in generator expression.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xfd,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    if (this->NestingLevel != 0) {
      __assert_fail("false && \"Got unexpected syntax token.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf7,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    local_80 = (this->it)._M_current;
    extendText(local_18,(const_iterator)local_80);
    local_88._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar2 = __gnu_cxx::operator!=(&this->it,&local_88);
    if (!bVar2) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf9,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator++(&this->it);
  }
  return;
}

Assistant:

void cmGeneratorExpressionParser::ParseContent(
  std::vector<cmGeneratorExpressionEvaluator*>& result)
{
  assert(this->it != this->Tokens.end());
  switch (this->it->TokenType) {
    case cmGeneratorExpressionToken::Text: {
      if (this->NestingLevel == 0) {
        if (!result.empty() &&
            (*(result.end() - 1))->GetType() ==
              cmGeneratorExpressionEvaluator::Text) {
          // A comma in 'plain text' could have split text that should
          // otherwise be continuous. Extend the last text content instead of
          // creating a new one.
          TextContent* textContent =
            static_cast<TextContent*>(*(result.end() - 1));
          textContent->Extend(this->it->Length);
          assert(this->it != this->Tokens.end());
          ++this->it;
          return;
        }
      }
      cmGeneratorExpressionEvaluator* n =
        new TextContent(this->it->Content, this->it->Length);
      result.push_back(n);
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
    }
    case cmGeneratorExpressionToken::BeginExpression:
      assert(this->it != this->Tokens.end());
      ++this->it;
      this->ParseGeneratorExpression(result);
      return;
    case cmGeneratorExpressionToken::EndExpression:
    case cmGeneratorExpressionToken::ColonSeparator:
    case cmGeneratorExpressionToken::CommaSeparator:
      if (this->NestingLevel == 0) {
        extendText(result, this->it);
      } else {
        assert(false && "Got unexpected syntax token.");
      }
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
  }
  assert(false && "Unhandled token in generator expression.");
}